

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O2

void __thiscall VehicleState::Propagator::State2OE(Propagator *this)

{
  double dVar1;
  double dVar2;
  ResScalar RVar3;
  ResScalar __x;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Vector3d nodeline;
  Vector3d ecen;
  Vector3d vel;
  Vector3d pos;
  Vector3d rhat;
  Vector3d ehat;
  Vector3d nhat;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_150 [2];
  double local_140;
  double *local_138;
  double local_120;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_118;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_78 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_60 [16];
  double local_50;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_48 [24];
  
  dVar6 = this->mu_;
  local_88 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[2];
  local_98 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
  dStack_90 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1];
  dVar4 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[0];
  dVar5 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[1];
  dVar12 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[2];
  dVar13 = SQRT(local_88 * local_88 + dStack_90 * dStack_90 + local_98 * local_98);
  dVar9 = local_88 * dVar4 - dVar12 * local_98;
  local_140 = 1.0 / dVar6;
  dVar14 = local_98 * dVar5 - dStack_90 * dVar4;
  dVar15 = dStack_90 * dVar12 - local_88 * dVar5;
  local_f8 = dVar5 * dVar14 - dVar9 * dVar12;
  dStack_f0 = dVar12 * dVar15 - dVar14 * dVar4;
  local_e8 = dVar4 * dVar9 - dVar5 * dVar15;
  local_120 = dVar6 / dVar13;
  local_138 = &local_f8;
  local_118 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_98;
  local_b8 = dVar4;
  dStack_b0 = dVar5;
  local_a8 = dVar12;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_d8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
              *)local_150);
  dVar1 = local_c8;
  dVar8 = dStack_d0;
  dVar7 = local_d8;
  dVar2 = acos(dVar14 / SQRT(dVar14 * dVar14 + dVar9 * dVar9 + dVar15 * dVar15));
  dVar10 = dVar15 - dVar14 * 0.0;
  local_f8 = dVar14 * 0.0 - dVar9;
  local_e8 = dVar9 * 0.0 + dVar15 * -0.0;
  dVar14 = SQRT(local_e8 * local_e8 + dVar10 * dVar10 + local_f8 * local_f8);
  dStack_f0 = dVar10;
  dVar9 = acos(local_f8 / dVar14);
  local_150[0] = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_f8;
  local_140 = dVar14;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_48,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                       *)local_150);
  local_140 = SQRT(local_c8 * local_c8 + dStack_d0 * dStack_d0 + local_d8 * local_d8);
  local_150[0] = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_d8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_60,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                       *)local_150);
  local_140 = SQRT(local_88 * local_88 + dStack_90 * dStack_90 + local_98 * local_98);
  local_150[0] = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_98;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_78,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                       *)local_150);
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_48,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_60);
  dVar14 = acos(RVar3);
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_b8,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_98);
  __x = Eigen::internal::
        dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
        ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_60,
              (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_78);
  dVar15 = acos(__x);
  dVar15 = (dVar15 * 180.0) / 3.141592653589793;
  dVar15 = (double)(-(ulong)(RVar3 < 0.0) & (ulong)(360.0 - dVar15) |
                   ~-(ulong)(RVar3 < 0.0) & (ulong)dVar15);
  dVar12 = SQRT(dVar5 * dVar5 + dVar4 * dVar4 + dVar12 * dVar12);
  dVar12 = -dVar6 / (dVar12 * dVar12 - (dVar6 + dVar6) / dVar13);
  dVar4 = pow(dVar12,3.0);
  dVar4 = dVar4 / dVar6;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar5 = SQRT(dVar8 * dVar8 + dVar7 * dVar7 + dVar1 * dVar1);
  dVar6 = (dVar12 * dVar12 * dVar12) / dVar6;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar7 = tan(((dVar15 * 3.141592653589793) / 180.0) * 0.5);
  dVar8 = (1.0 - dVar5) / (dVar5 + 1.0);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar7 = atan(dVar7 * dVar8);
  dVar7 = dVar7 + dVar7;
  dVar8 = (double)(~-(ulong)(dVar7 < 0.0) & (ulong)dVar7 |
                  (ulong)(dVar7 + 6.283185307179586) & -(ulong)(dVar7 < 0.0));
  dVar7 = sin(dVar8);
  this->a_ = dVar12;
  this->e_ = dVar5;
  this->i_ = (dVar2 * 180.0) / 3.141592653589793;
  auVar11._0_8_ = dVar9 * 180.0;
  auVar11._8_8_ = dVar14 * 180.0;
  auVar11 = divpd(auVar11,_DAT_00119970);
  this->ascend_ =
       (double)(~-(ulong)(dVar10 < 0.0) & (ulong)auVar11._0_8_ |
               (ulong)(360.0 - auVar11._0_8_) & -(ulong)(dVar10 < 0.0));
  this->periap_ =
       (double)(~-(ulong)(local_50 < 0.0) & (ulong)auVar11._8_8_ |
               (ulong)(360.0 - auVar11._8_8_) & -(ulong)(local_50 < 0.0));
  this->nu_ = dVar15;
  this->P_ = dVar4 * 6.283185307179586;
  this->T_p_ = (dVar8 - dVar7 * dVar5) / (-1.0 / dVar6) + this->t_;
  return;
}

Assistant:

void Propagator::State2OE(){

		// extract locals
		double mu = this->mu_;
		Eigen::Vector3d pos = this->pos_;
		Eigen::Vector3d vel = this->vel_;

		//normalized pos and vel
		double nr = pos.norm();
		double nv = vel.norm();

		//find the angular momentum vector
		Eigen::Vector3d h = pos.cross(vel);

		//now we can calculate semi-major axis
		double a = -mu/(pow(nv,2) - 2*mu/nr);

		//ecentricity vector
		Eigen::Vector3d ecen = (1/mu)*(vel.cross(h) - (mu/nr)*pos);

		//ecentricity
		double e = ecen.norm();

		//inclination
		double inc = acos(h[2]/h.norm()) * 180.0 / M_PI;

		// now we need the line of nodes
		Eigen::Vector3d x(0.0, 0.0, 1.0);
		Eigen::Vector3d nodeline = x.cross(h);

		//calculate longitude of ascending node
		double Ohm;
		if (nodeline[1] >= 0) {
			Ohm = acos(nodeline[0]/nodeline.norm()) * 180.0 / M_PI;
		} else {
			Ohm = 360.0 - acos(nodeline[0]/nodeline.norm()) * 180.0 / M_PI;
		}

		// normalized eccentricity, line of nodes, and position
		Eigen::Vector3d nhat = nodeline/nodeline.norm();
		Eigen::Vector3d ehat = ecen/ecen.norm();
		Eigen::Vector3d rhat = pos/pos.norm();

		// calculate argument of periapsis
		double w;
		if (ehat[2] >= 0) {
			w = acos(nhat.dot(ehat)) * 180.0 / M_PI; // Q1 or Q4
		} else {
			w = 360.0 - acos(nhat.dot(ehat)) * 180.0 / M_PI; // Q2 or Q3
		}

		//calculate true anomally
		double theta;
		if (vel.dot(pos) >= 0) {
			theta = acos(ehat.dot(rhat)) * 180.0 / M_PI; // Q1 or Q4
		} else {
			theta = 360.0 - acos(ehat.dot(rhat)) * 180.0 / M_PI; // Q2 or Q3
		}

		// convert theta to radians
		double theta_rad = theta*M_PI/180.0;

		//calculate orbital period
		double P = 2*M_PI*sqrt(pow(a,3)/mu);

		// //eccentric anomaly (radians)
		// double E = acos((e + cos(theta_rad))/(1 + e*cos(theta_rad)));

		// //mean anomally (radians)
		// double M = E - e*sin(E);

		// // time of periapsis passage
		// double T_p = this->t_ - M*P/(2*M_PI);

		//find mean motion
		double meanmot = 1.0/sqrt(a*a*a/mu);

		//eccentric annomaly
		double E = 2.0*atan( tan(theta_rad/2.0) * sqrt( (1.0 - e)/(1.0 + e)));

		//guard domain
		if(E < 0.0) {
			E = E + 2.0*M_PI;
		}

		//mean anomally (radians)
		double M = E - e*sin(E);

		// time of periapsis passage
		double T_p = this->t_ - M/meanmot;

		// output our results
		// std::cout << "semi-major axis [km]: " << a << std::endl;
		// std::cout << "eccentricity: " << e << std::endl;
		// std::cout << "inclination [deg]: " << inc << std::endl;
		// std::cout << "longitude of ascending node [deg]: " << Ohm << std::endl;
		// std::cout << "argument of periapsis [deg]: " << w << std::endl;
		// std::cout << "true anomally [deg]: " << theta << std::endl;
		// std::cout << "time of periapsis passage: " T_p << std::endl;

		//assign results to class
		this->a_ = a; //semi-major axis
		this->e_ = e; //eccentricity
		this->i_ = inc; //inclination
		this->ascend_ = Ohm; //longitude of ascending node
		this->periap_ = w; //argument of periapsis
		this->nu_ = theta; //true anomaly
		this->P_ = P; //orbital period 
		this->T_p_ = T_p; //time from periapse

	}